

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

int32_t unorm2_normalize_63(UNormalizer2 *norm2,UChar *src,int32_t length,UChar *dest,
                           int32_t capacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UChar *local_160;
  UChar *local_140;
  Char16Ptr local_130;
  ConstChar16Ptr local_128;
  undefined1 local_120 [8];
  UnicodeString srcString;
  undefined1 local_d0 [8];
  ReorderingBuffer buffer;
  Normalizer2WithImpl *n2wi;
  Normalizer2 *n2;
  UnicodeString destString;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  UChar *dest_local;
  int32_t length_local;
  UChar *src_local;
  UNormalizer2 *norm2_local;
  
  destString.fUnion._48_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if (src == (UChar *)0x0) {
    if (length != 0) goto LAB_003f68b8;
  }
  else if (length < -1) goto LAB_003f68b8;
  if (dest == (UChar *)0x0) {
    if (capacity != 0) goto LAB_003f68b8;
  }
  else if (capacity < 0) goto LAB_003f68b8;
  if ((src != dest) || (src == (UChar *)0x0)) {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&n2,dest,0,capacity);
    if (length != 0) {
      if (norm2 == (UNormalizer2 *)0x0) {
        local_140 = (UChar *)0x0;
      }
      else {
        local_140 = (UChar *)__dynamic_cast(norm2,&icu_63::Normalizer2::typeinfo,
                                            &icu_63::Normalizer2WithImpl::typeinfo,0);
      }
      buffer.codePointLimit = local_140;
      if (local_140 == (UChar *)0x0) {
        icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_128,src);
        icu_63::UnicodeString::UnicodeString
                  ((UnicodeString *)local_120,(byte)((uint)length >> 0x1f),&local_128,length);
        icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_128);
        (**(code **)(*(long *)norm2 + 0x18))(norm2,local_120,&n2,destString.fUnion._48_8_);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_120);
      }
      else {
        icu_63::ReorderingBuffer::ReorderingBuffer
                  ((ReorderingBuffer *)local_d0,*(Normalizer2Impl **)(local_140 + 4),
                   (UnicodeString *)&n2);
        iVar2 = icu_63::ReorderingBuffer::init
                          ((ReorderingBuffer *)local_d0,(EVP_PKEY_CTX *)(ulong)(uint)length);
        if ((char)iVar2 != '\0') {
          if (length < 0) {
            local_160 = (UChar *)0x0;
          }
          else {
            local_160 = src + length;
          }
          (**(code **)(*(long *)buffer.codePointLimit + 0x90))
                    (buffer.codePointLimit,src,local_160,local_d0,destString.fUnion._48_8_);
        }
        icu_63::ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_d0);
      }
    }
    icu_63::Char16Ptr::Char16Ptr(&local_130,dest);
    iVar3 = icu_63::UnicodeString::extract
                      ((UnicodeString *)&n2,&local_130,capacity,
                       (UErrorCode *)destString.fUnion._48_8_);
    icu_63::Char16Ptr::~Char16Ptr(&local_130);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&n2);
    return iVar3;
  }
LAB_003f68b8:
  *(undefined4 *)destString.fUnion._48_8_ = 1;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_normalize(const UNormalizer2 *norm2,
                 const UChar *src, int32_t length,
                 UChar *dest, int32_t capacity,
                 UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if( (src==NULL ? length!=0 : length<-1) ||
        (dest==NULL ? capacity!=0 : capacity<0) ||
        (src==dest && src!=NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString destString(dest, 0, capacity);
    // length==0: Nothing to do, and n2wi->normalize(NULL, NULL, buffer, ...) would crash.
    if(length!=0) {
        const Normalizer2 *n2=(const Normalizer2 *)norm2;
        const Normalizer2WithImpl *n2wi=dynamic_cast<const Normalizer2WithImpl *>(n2);
        if(n2wi!=NULL) {
            // Avoid duplicate argument checking and support NUL-terminated src.
            ReorderingBuffer buffer(n2wi->impl, destString);
            if(buffer.init(length, *pErrorCode)) {
                n2wi->normalize(src, length>=0 ? src+length : NULL, buffer, *pErrorCode);
            }
        } else {
            UnicodeString srcString(length<0, src, length);
            n2->normalize(srcString, destString, *pErrorCode);
        }
    }
    return destString.extract(dest, capacity, *pErrorCode);
}